

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O3

bool __thiscall
iDynTree::LinkContactWrenches::computeNetWrenches
          (LinkContactWrenches *this,LinkNetExternalWrenches *netWrenches)

{
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  Wrench *pWVar5;
  Wrench *pWVar6;
  uint i;
  ulong uVar7;
  size_t nrOfLinks;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  Wrench link_wrench_due_to_contact;
  Transform link_H_contact;
  SpatialForceVector local_110 [56];
  Transform local_d8 [72];
  Wrench local_90;
  
  sVar3 = LinkWrenches::getNrOfLinks(netWrenches);
  sVar4 = LinkWrenches::getNrOfLinks(netWrenches);
  nrOfLinks = ((long)(this->m_linkContactWrenches).
                     super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_linkContactWrenches).
                     super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (sVar4 != nrOfLinks) {
    LinkWrenches::resize(netWrenches,nrOfLinks);
  }
  if (0 < (long)sVar3) {
    sVar4 = 0;
    do {
      pWVar5 = LinkWrenches::operator()(netWrenches,sVar4);
      uVar7 = 0;
      pWVar6 = pWVar5;
      do {
        pWVar6 = (Wrench *)&pWVar6->field_0x8;
        puVar8 = (undefined8 *)(&pWVar5->field_0x20 + (ulong)((int)uVar7 - 3) * 8);
        if (uVar7 < 3) {
          puVar8 = (undefined8 *)pWVar6;
        }
        *puVar8 = 0;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 6);
      pvVar1 = (this->m_linkContactWrenches).
               super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)*(pointer *)
                     ((long)&pvVar1[sVar4].
                             super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                             ._M_impl + 8) -
              *(long *)&pvVar1[sVar4].
                        super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                        ._M_impl;
      if (lVar9 != 0) {
        lVar10 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        lVar9 = 0x18;
        do {
          lVar2 = *(long *)&(this->m_linkContactWrenches).
                            super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar4].
                            super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                            ._M_impl;
          iDynTree::Rotation::Identity();
          iDynTree::Transform::Transform
                    ((Transform *)&local_90,(Rotation *)local_d8,(Position *)(lVar2 + lVar9 + -0x18)
                    );
          iDynTree::Transform::operator*(local_d8,&local_90);
          pWVar6 = LinkWrenches::operator()(netWrenches,sVar4);
          iDynTree::Wrench::operator+((Wrench *)local_110,pWVar6);
          pWVar6 = LinkWrenches::operator()(netWrenches,sVar4);
          iDynTree::Wrench::operator=(pWVar6,(Wrench *)local_110);
          iDynTree::SpatialForceVector::~SpatialForceVector(local_110);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_d8);
          lVar9 = lVar9 + 0x58;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != sVar3);
  }
  return true;
}

Assistant:

bool LinkContactWrenches::computeNetWrenches(LinkNetExternalWrenches& netWrenches) const
{
    // Resize the output if necessary
    size_t nrOfLinks =  netWrenches.getNrOfLinks();
    if( netWrenches.getNrOfLinks() != m_linkContactWrenches.size() )
    {
        netWrenches.resize(m_linkContactWrenches.size());
    }

    for(LinkIndex l=0; l < static_cast<LinkIndex>(nrOfLinks); l++)
    {
        netWrenches(l).zero();

        // sum all the contact wrenches
        size_t nrOfContacts = this->getNrOfContactsForLink(l);
        for(size_t c=0; c < nrOfContacts; c++)
        {
            // Each contact wrench is expressed with respect to the contact point
            // and with the orientation of the link frame, so we need to translate it
            // to the link frame
            const ContactWrench & contact = this->contactWrench(l,c);

            Transform link_H_contact(Rotation::Identity(),contact.contactPoint());

            Wrench link_wrench_due_to_contact = link_H_contact*contact.contactWrench();

            netWrenches(l) = netWrenches(l) + link_wrench_due_to_contact;
        }
    }

    return true;
}